

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawPlane
          (cbtIDebugDraw *this,cbtVector3 *planeNormal,cbtScalar planeConst,cbtTransform *transform,
          cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar1 = planeNormal->m_floats[0];
  fVar2 = planeNormal->m_floats[1];
  fVar3 = planeNormal->m_floats[2];
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx512vl(ZEXT416((uint)fVar3),auVar12);
  if (auVar12._0_4_ <= 0.70710677) {
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar1),
                              ZEXT416((uint)fVar1));
    fVar14 = auVar12._0_4_;
    if (fVar14 < 0.0) {
      fVar19 = sqrtf(fVar14);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar19 = auVar12._0_4_;
    }
    fVar26 = 0.0;
    fVar19 = 1.0 / fVar19;
    fVar24 = fVar19 * -planeNormal->m_floats[1];
    fVar17 = fVar19 * planeNormal->m_floats[0];
    fVar15 = fVar17 * -planeNormal->m_floats[2];
    fVar18 = fVar24 * planeNormal->m_floats[2];
    fVar14 = fVar14 * fVar19;
    fVar24 = fVar24 * 100.0;
  }
  else {
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar2),
                              ZEXT416((uint)fVar2));
    fVar15 = auVar12._0_4_;
    if (fVar15 < 0.0) {
      fVar14 = sqrtf(fVar15);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar14 = auVar12._0_4_;
    }
    fVar24 = 0.0;
    fVar14 = 1.0 / fVar14;
    fVar17 = fVar14 * -planeNormal->m_floats[2];
    fVar26 = fVar14 * planeNormal->m_floats[1];
    fVar15 = fVar15 * fVar14;
    fVar18 = fVar26 * -planeNormal->m_floats[0];
    fVar14 = fVar17 * planeNormal->m_floats[0];
    fVar26 = fVar26 * 100.0;
  }
  fVar3 = fVar3 * planeConst;
  fVar2 = fVar2 * planeConst;
  fVar1 = fVar1 * planeConst;
  fVar4 = fVar24 + fVar1;
  fVar5 = fVar2 + fVar17 * 100.0;
  fVar6 = fVar26 + fVar3;
  fVar24 = fVar1 - fVar24;
  fVar10 = fVar2 - fVar17 * 100.0;
  fVar26 = fVar3 - fVar26;
  fVar7 = fVar1 + fVar15 * 100.0;
  fVar8 = fVar2 + fVar18 * 100.0;
  fVar9 = fVar3 + fVar14 * 100.0;
  fVar1 = fVar1 - fVar15 * 100.0;
  fVar2 = fVar2 - fVar18 * 100.0;
  fVar3 = fVar3 - fVar14 * 100.0;
  fVar14 = (transform->m_basis).m_el[0].m_floats[1];
  auVar16 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar14)),ZEXT416((uint)fVar4),auVar16);
  auVar20 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar6),auVar20);
  fVar19 = (transform->m_basis).m_el[1].m_floats[1];
  auVar21 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar19)),ZEXT416((uint)fVar4),auVar21);
  auVar23 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar6),auVar23);
  fVar17 = (transform->m_basis).m_el[2].m_floats[1];
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar17)),auVar25,ZEXT416((uint)fVar4));
  auVar22 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar11 = vfmadd231ss_fma(auVar11,auVar22,ZEXT416((uint)fVar6));
  fVar15 = (transform->m_origin).m_floats[0];
  auVar27 = ZEXT416((uint)(transform->m_origin).m_floats[1]);
  auVar13 = vaddss_avx512f(auVar13,auVar27);
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar15 + auVar12._0_4_)),auVar13,0x10);
  fVar18 = (transform->m_origin).m_floats[2];
  local_38 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar11._0_4_ + fVar18)),0x28);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar14)),ZEXT416((uint)fVar24),auVar16);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar26),auVar20);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar19)),ZEXT416((uint)fVar24),auVar21);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar26),auVar23);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar10)),ZEXT416((uint)fVar24),auVar25);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar26),auVar22);
  auVar13 = vaddss_avx512f(auVar13,auVar27);
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar15 + auVar12._0_4_)),auVar13,0x10);
  local_48 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar11._0_4_ + fVar18)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_38,local_48,color);
  fVar14 = (transform->m_basis).m_el[0].m_floats[1];
  auVar16 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar14)),ZEXT416((uint)fVar7),auVar16);
  auVar20 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar9),auVar20);
  fVar19 = (transform->m_basis).m_el[1].m_floats[1];
  auVar21 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar19)),ZEXT416((uint)fVar7),auVar21);
  auVar22 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar9),auVar22);
  fVar17 = (transform->m_basis).m_el[2].m_floats[1];
  auVar23 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar17)),auVar23,ZEXT416((uint)fVar7));
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar11 = vfmadd231ss_fma(auVar11,auVar25,ZEXT416((uint)fVar9));
  fVar15 = (transform->m_origin).m_floats[0];
  fVar18 = (transform->m_origin).m_floats[1];
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar15 + auVar12._0_4_)),
                          ZEXT416((uint)(fVar18 + auVar13._0_4_)),0x10);
  fVar26 = (transform->m_origin).m_floats[2];
  local_38 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar11._0_4_ + fVar26)),0x28);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar14)),ZEXT416((uint)fVar1),auVar16);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar3),auVar20);
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar19)),ZEXT416((uint)fVar1),auVar21);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar3),auVar22);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar17)),ZEXT416((uint)fVar1),auVar23);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar3),auVar25);
  auVar12 = vinsertps_avx(ZEXT416((uint)(fVar15 + auVar12._0_4_)),
                          ZEXT416((uint)(fVar18 + auVar13._0_4_)),0x10);
  local_48 = vinsertps_avx(auVar12,ZEXT416((uint)(auVar11._0_4_ + fVar26)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_38,local_48,color);
  return;
}

Assistant:

virtual void drawPlane(const cbtVector3& planeNormal, cbtScalar planeConst, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 planeOrigin = planeNormal * planeConst;
		cbtVector3 vec0, vec1;
		cbtPlaneSpace1(planeNormal, vec0, vec1);
		cbtScalar vecLen = 100.f;
		cbtVector3 pt0 = planeOrigin + vec0 * vecLen;
		cbtVector3 pt1 = planeOrigin - vec0 * vecLen;
		cbtVector3 pt2 = planeOrigin + vec1 * vecLen;
		cbtVector3 pt3 = planeOrigin - vec1 * vecLen;
		drawLine(transform * pt0, transform * pt1, color);
		drawLine(transform * pt2, transform * pt3, color);
	}